

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

vec4 vec4_create(float x,float y,float z,float w)

{
  vec4 vVar1;
  
  vVar1.y = y;
  vVar1.x = x;
  vVar1.w = w;
  vVar1.z = z;
  return vVar1;
}

Assistant:

vec4 vec4_create(float x, float y, float z, float w) {
    vec4 v;
    v.x = x;
    v.y = y;
    v.z = z;
    v.w = w;
    return v;
}